

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

String * __thiscall
Diligent::GetCPUAccessFlagsString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,Uint32 CpuAccessFlags)

{
  long lVar1;
  Char *pCVar2;
  undefined1 local_50 [8];
  string msg;
  Uint32 Flag;
  allocator local_15;
  uint local_14;
  String *pSStack_10;
  Uint32 CpuAccessFlags_local;
  String *Str;
  
  local_14 = (uint)this;
  pSStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    for (msg.field_2._12_4_ = 1; local_14 != 0 && (uint)msg.field_2._12_4_ < 3;
        msg.field_2._12_4_ = msg.field_2._12_4_ << 1) {
      if ((local_14 & msg.field_2._12_4_) != 0) {
        lVar1 = std::__cxx11::string::length();
        if (lVar1 != 0) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'|');
        }
        pCVar2 = GetSingleCPUAccessFlagString(msg.field_2._12_4_);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pCVar2);
        local_14 = (msg.field_2._12_4_ ^ 0xffffffff) & local_14;
      }
    }
    if (local_14 != 0) {
      FormatString<char[30]>((string *)local_50,(char (*) [30])"Unknown CPU access flags left");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"GetCPUAccessFlagsString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x4d3);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String GetCPUAccessFlagsString(Uint32 CpuAccessFlags)
{
    if (CpuAccessFlags == 0)
        return "0";
    String Str;
    for (Uint32 Flag = CPU_ACCESS_READ; CpuAccessFlags && Flag <= CPU_ACCESS_WRITE; Flag <<= 1)
    {
        if (CpuAccessFlags & Flag)
        {
            if (Str.length())
                Str += '|';
            Str += GetSingleCPUAccessFlagString(Flag);
            CpuAccessFlags &= ~Flag;
        }
    }
    VERIFY(CpuAccessFlags == 0, "Unknown CPU access flags left");
    return Str;
}